

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_out_new_memory(char **strp,size_t size,ly_out **out)

{
  ly_out *plVar1;
  ly_out **out_local;
  size_t size_local;
  char **strp_local;
  
  if (out == (ly_out **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_new_memory")
    ;
    strp_local._4_4_ = LY_EINVAL;
  }
  else if (strp == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","strp","ly_out_new_memory"
          );
    strp_local._4_4_ = LY_EINVAL;
  }
  else {
    plVar1 = (ly_out *)calloc(1,0x50);
    *out = plVar1;
    if (*out == (ly_out *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_out_new_memory");
      strp_local._4_4_ = LY_EMEM;
    }
    else {
      (*out)->type = LY_OUT_MEMORY;
      ((*out)->method).mem.buf = strp;
      if (size == 0) {
        *strp = (char *)0x0;
      }
      else if (*strp != (char *)0x0) {
        ((*out)->method).mem.size = size;
      }
      strp_local._4_4_ = LY_SUCCESS;
    }
  }
  return strp_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_new_memory(char **strp, size_t size, struct ly_out **out)
{
    LY_CHECK_ARG_RET(NULL, out, strp, LY_EINVAL);

    *out = calloc(1, sizeof **out);
    LY_CHECK_ERR_RET(!*out, LOGMEM(NULL), LY_EMEM);

    (*out)->type = LY_OUT_MEMORY;
    (*out)->method.mem.buf = strp;
    if (!size) {
        /* buffer is supposed to be allocated */
        *strp = NULL;
    } else if (*strp) {
        /* there is already buffer to use */
        (*out)->method.mem.size = size;
    }

    return LY_SUCCESS;
}